

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cc
# Opt level: O1

ssize_t __thiscall
pstack::OffsetReader::read(OffsetReader *this,int __fd,void *__buf,size_t __nbytes)

{
  ulong uVar1;
  element_type *peVar2;
  int iVar3;
  undefined4 extraout_var;
  Exception *this_00;
  void *pvVar4;
  undefined4 in_register_00000034;
  ulong uVar5;
  Exception local_1c8;
  
  uVar5 = CONCAT44(in_register_00000034,__fd);
  uVar1 = this->length;
  if (uVar5 <= uVar1) {
    pvVar4 = (void *)(uVar1 - uVar5);
    if ((long)__buf + uVar5 <= uVar1) {
      pvVar4 = __buf;
    }
    peVar2 = (this->upstream).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    iVar3 = (*peVar2->_vptr_Reader[2])(peVar2,uVar5 + this->offset,pvVar4);
    return CONCAT44(extraout_var,iVar3);
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x1a0,uVar5,(void *)(uVar1 - uVar5));
  memset(&local_1c8,0,0x1a0);
  Exception::Exception(&local_1c8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1c8.str,"read past end of object ",0x18);
  (*(this->super_Reader)._vptr_Reader[5])(this,&local_1c8.str);
  Exception::Exception(this_00,&local_1c8);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

size_t
OffsetReader::read(Off off, size_t count, char *ptr) const {
    if (off > length)
       throw Exception() << "read past end of object " << *this;
    if (off + Off(count) > length)
       count = length - off;
    return upstream->read(off + offset, count, ptr);
}